

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

SubroutineSymbol *
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,ClassMethodDeclarationSyntax *syntax,Scope *parent)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  TokenList *qualifiers;
  FunctionPrototypeSyntax *proto;
  type *r;
  type *ptVar2;
  SubroutineSymbol *in_RDX;
  Scope *in_RDI;
  type *visibility;
  type *flags;
  type_conflict2 *_;
  type *result;
  undefined1 in_stack_0000027f;
  Scope *in_stack_00000280;
  FunctionDeclarationSyntax *in_stack_00000288;
  Compilation *in_stack_00000290;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffff48;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffff50;
  type type;
  SubroutineSymbol *this;
  Symbol *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff90;
  SubroutineSymbol *local_8;
  
  not_null<slang::syntax::FunctionDeclarationSyntax_*>::operator*
            ((not_null<slang::syntax::FunctionDeclarationSyntax_*> *)0x5468f0);
  fromSyntax(in_stack_00000290,in_stack_00000288,in_stack_00000280,(bool)in_stack_0000027f);
  qualifiers = (TokenList *)
               std::get<0ul,slang::ast::SubroutineSymbol*,bool>
                         ((pair<slang::ast::SubroutineSymbol_*,_bool> *)0x54693b);
  proto = (FunctionPrototypeSyntax *)
          std::get<1ul,slang::ast::SubroutineSymbol*,bool>
                    ((pair<slang::ast::SubroutineSymbol_*,_bool> *)0x54694d);
  if ((type)(qualifiers->super_SyntaxListBase)._vptr_SyntaxListBase == (type)0x0) {
    local_8 = (SubroutineSymbol *)0x0;
  }
  else {
    type = (type)(qualifiers->super_SyntaxListBase)._vptr_SyntaxListBase;
    this = in_RDX;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_RDX,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)type);
    syntax_00._M_extent._M_extent_value = in_stack_ffffffffffffff90._M_extent_value;
    syntax_00._M_ptr = in_stack_ffffffffffffff88;
    Symbol::setAttributes(in_stack_ffffffffffffff80,in_RDI,syntax_00);
    not_null<slang::syntax::FunctionDeclarationSyntax_*>::operator->
              ((not_null<slang::syntax::FunctionDeclarationSyntax_*> *)0x5469dc);
    not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
              ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x5469e8);
    getMethodFlags(qualifiers,proto);
    r = std::get<0ul,slang::bitmask<slang::ast::MethodFlags>,slang::ast::Visibility>
                  ((pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> *)0x546a04
                  );
    ptVar2 = std::get<1ul,slang::bitmask<slang::ast::MethodFlags>,slang::ast::Visibility>
                       ((pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> *)
                        0x546a13);
    *(type *)((qualifiers->super_SyntaxListBase)._vptr_SyntaxListBase + 0x18) = *ptVar2;
    bitmask<slang::ast::MethodFlags>::operator|=
              ((bitmask<slang::ast::MethodFlags> *)
               ((long)(qualifiers->super_SyntaxListBase)._vptr_SyntaxListBase + 0xc4),r);
    bitmask<slang::ast::MethodFlags>::bitmask
              ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffff86,Static);
    bVar1 = bitmask<slang::ast::MethodFlags>::has
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      Scope::asSymbol((Scope *)in_RDX);
      Symbol::as<slang::ast::ClassType>((Symbol *)0x546aa1);
      addThisVar(this,(Type *)type);
    }
    local_8 = (SubroutineSymbol *)(qualifiers->super_SyntaxListBase)._vptr_SyntaxListBase;
  }
  return local_8;
}

Assistant:

SubroutineSymbol* SubroutineSymbol::fromSyntax(Compilation& compilation,
                                               const ClassMethodDeclarationSyntax& syntax,
                                               const Scope& parent) {
    auto [result, _] = fromSyntax(compilation, *syntax.declaration, parent, /* outOfBlock */ false);
    if (!result)
        return nullptr;

    result->setAttributes(parent, syntax.attributes);

    auto [flags, visibility] = getMethodFlags(syntax.qualifiers, *syntax.declaration->prototype);
    result->visibility = visibility;
    result->flags |= flags;

    if (!result->flags.has(MethodFlags::Static))
        result->addThisVar(parent.asSymbol().as<ClassType>());

    return result;
}